

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
base_iterator_matrix_sparse_element_test_const_iterator_Test::
~base_iterator_matrix_sparse_element_test_const_iterator_Test
          (base_iterator_matrix_sparse_element_test_const_iterator_Test *this)

{
  base_iterator_matrix_sparse_element_test_const_iterator_Test *this_local;
  
  ~base_iterator_matrix_sparse_element_test_const_iterator_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(base_iterator_matrix_sparse_element_test, const_iterator) {
  Base_Iterator_Matrix_Sparse_Element<double, int, true> const_it(&columns[0], &entries[0]);

  const auto element = *const_it;
  EXPECT_EQ((*const_it).i_column(), 0);
  EXPECT_EQ((*const_it).value(), 1.0);

  // ensure we can increment and decrement the const iterator
  ++const_it;
  const_it++;
  EXPECT_EQ((*const_it).i_column(), 2);
  EXPECT_EQ((*const_it).value(), 3.0);
  --const_it;
  const_it--;
  EXPECT_EQ((*const_it).i_column(), 0);
  EXPECT_EQ((*const_it).value(), 1.0);

  // Ensure that we can't modify the value through a const iterator
  static_assert(std::is_const_v<std::remove_reference_t<decltype(element.value())>>,
                "Const iterator should return const references");
}